

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

void __thiscall JSONNode::merge(JSONNode *this,JSONNode *other)

{
  internalJSONNode *piVar1;
  bool condition;
  JSONNode *orig;
  allocator local_41;
  json_string local_40;
  
  piVar1 = this->internal;
  std::__cxx11::string::string((string *)&local_40,"no internal",&local_41);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (this->internal != other->internal) {
    condition = operator==(this,other);
    std::__cxx11::string::string
              ((string *)&local_40,"merging two nodes that aren\'t equal",&local_41);
    JSONDebug::_JSON_ASSERT(condition,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    orig = this;
    if (this->internal->refcount < other->internal->refcount) {
      orig = other;
      other = this;
    }
    operator=(other,orig);
  }
  return;
}

Assistant:

void JSONNode::merge(JSONNode &) json_nothrow {
#endif
    JSON_CHECK_INTERNAL();
    #ifdef JSON_REF_COUNT
	   if (internal == other.internal) return;
	   JSON_ASSERT(*this == other, JSON_TEXT("merging two nodes that aren't equal"));
	   if (internal -> refcount < other.internal -> refcount){
		  *this = other;
	   } else {
		  other = *this;
	   }
    #endif
}